

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

int lyd_merge_siblings(lyd_node *target,lyd_node *source,int options)

{
  LYS_NODE LVar1;
  ly_ctx *ctx;
  byte bVar2;
  int iVar3;
  lyd_node *node2;
  lyd_node *plVar4;
  lyd_node *node1;
  bool bVar5;
  lyd_node *local_40;
  
  ctx = target->schema->module->ctx;
  do {
    plVar4 = target;
    target = plVar4->prev;
  } while (plVar4->prev->next != (lyd_node *)0x0);
  bVar2 = 0;
  local_40 = source;
  do {
    node2 = source;
    if (node2 == (lyd_node *)0x0) {
      lyd_free_withsiblings(local_40);
      return (uint)bVar2 * 2;
    }
    source = node2->next;
    node1 = plVar4;
    bVar5 = plVar4 == (lyd_node *)0x0;
    if (plVar4 != (lyd_node *)0x0) {
      do {
        iVar3 = lyd_merge_node_schema_equal(node1,node2);
        if (iVar3 == 1) {
          iVar3 = lyd_merge_node_equal(node1,node2);
        }
        if (0 < iVar3) {
          if (iVar3 == 2) {
            bVar2 = 1;
          }
          LVar1 = node1->schema->nodetype;
          if ((int)LVar1 < 0x80) {
            if ((int)LVar1 < 8) {
              if (LVar1 == LYS_CONTAINER) goto LAB_0016aae7;
              if (LVar1 == LYS_LEAF) goto LAB_0016aac8;
            }
            else {
              if (LVar1 == LYS_LEAFLIST) break;
              if (LVar1 == LYS_LIST) {
LAB_0016aae7:
                iVar3 = lyd_merge_parent_children(node1,node2->child,options);
                if ((iVar3 != 0) && (bVar2 = 1, iVar3 != 2)) goto LAB_0016abb2;
                break;
              }
              if (LVar1 == LYS_ANYXML) {
LAB_0016aac8:
                lyd_merge_node_update(node1,node2);
                break;
              }
            }
          }
          else if ((int)LVar1 < 0x200) {
            if ((LVar1 == LYS_NOTIF) || (LVar1 == LYS_RPC)) goto LAB_0016aae7;
          }
          else {
            if ((LVar1 == LYS_INPUT) || (LVar1 == LYS_OUTPUT)) goto LAB_0016aae7;
            if (LVar1 == LYS_ANYDATA) goto LAB_0016aac8;
          }
          ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                 ,0xb79);
LAB_0016abb2:
          lyd_free_withsiblings(local_40);
          return 1;
        }
        if (iVar3 == -1) goto LAB_0016abb2;
        bVar5 = node1->next == (lyd_node *)0x0;
        node1 = node1->next;
      } while (!bVar5);
    }
    if (bVar5) {
      if (ctx == node2->schema->module->ctx) {
        lyd_unlink_internal(node2,1);
        if (node2 == local_40) {
          local_40 = source;
        }
      }
      else {
        node2 = lyd_dup_to_ctx(node2,1,ctx);
      }
      lyd_insert_after(plVar4->prev,node2);
    }
  } while( true );
}

Assistant:

static int
lyd_merge_siblings(struct lyd_node *target, struct lyd_node *source, int options)
{
    struct lyd_node *trg, *src, *src_backup, *ins;
    int ret, clear_flag = 0;
    struct ly_ctx *ctx = target->schema->module->ctx; /* shortcut */

    while (target->prev->next) {
        target = target->prev;
    }

    LY_TREE_FOR_SAFE(source, src_backup, src) {
        LY_TREE_FOR(target, trg) {
            /* sibling found, merge it */
            ret = lyd_merge_node_schema_equal(trg, src);
            if (ret == 1) {
                ret = lyd_merge_node_equal(trg, src);
            }
            if (ret > 0) {
                if (ret == 2) {
                    clear_flag = 1;
                }

                switch (trg->schema->nodetype) {
                case LYS_LEAF:
                case LYS_ANYXML:
                case LYS_ANYDATA:
                    lyd_merge_node_update(trg, src);
                    break;
                case LYS_LEAFLIST:
                    /* it's already there, nothing to do */
                    break;
                case LYS_LIST:
                case LYS_CONTAINER:
                case LYS_NOTIF:
                case LYS_RPC:
                case LYS_INPUT:
                case LYS_OUTPUT:
                    ret = lyd_merge_parent_children(trg, src->child, options);
                    if (ret == 2) {
                        clear_flag = 1;
                    } else if (ret) {
                        lyd_free_withsiblings(source);
                        return 1;
                    }
                    break;
                default:
                    LOGINT(ctx);
                    lyd_free_withsiblings(source);
                    return 1;
                }
                break;
            } else if (ret == -1) {
                lyd_free_withsiblings(source);
                return 1;
            } /* else not equal, nothing to do */
        }

        /* sibling not found, insert it */
        if (!trg) {
            if (ctx != src->schema->module->ctx) {
                ins = lyd_dup_to_ctx(src, 1, ctx);
            } else {
                lyd_unlink(src);
                if (src == source) {
                    /* just so source is not freed, we inserted it and need it further */
                    source = src_backup;
                }
                ins = src;
            }
            lyd_insert_after(target->prev, ins);
        }
    }

    lyd_free_withsiblings(source);
    if (clear_flag) {
        return 2;
    }
    return 0;
}